

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::DiskHandle::WritableFileMappingImpl> *this,
          void *pointer)

{
  if (pointer != (void *)0x0) {
    Array<unsigned_char>::~Array((Array<unsigned_char> *)((long)pointer + 8));
  }
  operator_delete(pointer,0x20);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }